

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.h
# Opt level: O2

RelationalExpr __thiscall
mp::
ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
::Convert(ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
          *this,LogicalCountExpr e,Kind kind)

{
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  BVar1;
  
  BVar1 = BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                    ((BasicExprFactory<std::allocator<char>> *)&this->factory_,kind,
                     (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                     ((ExprBase *)
                     ((long)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase
                            .impl_ + 8))->impl_,
                     (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                     ((ExprBase *)
                     ((long)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase
                            .impl_ + 0x10))->impl_);
  return (RelationalExpr)
         BVar1.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_;
}

Assistant:

RelationalExpr Convert(LogicalCountExpr e, expr::Kind kind) {
    return factory_.MakeRelational(kind, e.lhs(), e.rhs());
  }